

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANSIFontWriter.cpp
# Opt level: O0

EStatusCode __thiscall
ANSIFontWriter::WriteFont
          (ANSIFontWriter *this,FreeTypeFaceWrapper *inFontInfo,
          WrittenFontRepresentation *inFontOccurrence,ObjectsContext *inObjectsContext,
          IANSIFontWriterHelper *inANSIFontWriterHelper,string *inSubsetFontName)

{
  EStatusCode EVar1;
  string *inFontPostscriptName;
  uint uVar2;
  int iVar3;
  Trace *pTVar4;
  DictionaryContext *this_00;
  IndirectObjectsReferenceRegistry *pIVar5;
  ObjectIDType inObjectReference;
  ObjectIDType inObjectReference_00;
  size_type sVar6;
  undefined4 extraout_var;
  ObjectIDType fontDescriptorObjectID;
  ObjectIDType toUnicodeMapObjectID;
  DictionaryContext *fontContext;
  FontDescriptorWriter local_3d;
  EStatusCode local_3c;
  FontDescriptorWriter fontDescriptorWriter;
  string *psStack_38;
  EStatusCode status;
  string *inSubsetFontName_local;
  IANSIFontWriterHelper *inANSIFontWriterHelper_local;
  ObjectsContext *inObjectsContext_local;
  WrittenFontRepresentation *inFontOccurrence_local;
  FreeTypeFaceWrapper *inFontInfo_local;
  ANSIFontWriter *this_local;
  
  local_3c = 0;
  psStack_38 = inSubsetFontName;
  FontDescriptorWriter::FontDescriptorWriter(&local_3d);
  local_3c = ObjectsContext::StartNewIndirectObject
                       (inObjectsContext,inFontOccurrence->mWrittenObjectID);
  if (local_3c == eSuccess) {
    this->mFontInfo = inFontInfo;
    this->mFontOccurrence = inFontOccurrence;
    this->mObjectsContext = inObjectsContext;
    this_00 = ObjectsContext::StartDictionary(inObjectsContext);
    DictionaryContext::WriteKey(this_00,&scType_abi_cxx11_);
    DictionaryContext::WriteNameValue(this_00,&scFont_abi_cxx11_);
    DictionaryContext::WriteKey(this_00,&scSubtype_abi_cxx11_);
    (*inANSIFontWriterHelper->_vptr_IANSIFontWriterHelper[2])(inANSIFontWriterHelper,this_00);
    DictionaryContext::WriteKey(this_00,&scBaseFont_abi_cxx11_);
    DictionaryContext::WriteNameValue(this_00,psStack_38);
    CalculateCharacterEncodingArray(this);
    WriteWidths(this,this_00);
    uVar2 = (*inANSIFontWriterHelper->_vptr_IANSIFontWriterHelper[4])();
    if ((uVar2 & 1) != 0) {
      CalculateDifferences(this);
    }
    WriteEncoding(this,this_00);
    DictionaryContext::WriteKey(this_00,&scToUnicode_abi_cxx11_);
    pIVar5 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
    inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar5);
    DictionaryContext::WriteNewObjectReferenceValue(this_00,inObjectReference);
    DictionaryContext::WriteKey(this_00,&scFontDescriptor_abi_cxx11_);
    pIVar5 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
    inObjectReference_00 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar5);
    DictionaryContext::WriteNewObjectReferenceValue(this_00,inObjectReference_00);
    local_3c = ObjectsContext::EndDictionary(inObjectsContext,this_00);
    if (local_3c == eSuccess) {
      ObjectsContext::EndIndirectObject(inObjectsContext);
      sVar6 = std::__cxx11::
              list<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size(&this->mDifferences);
      if (sVar6 != 0) {
        local_3c = WriteEncodingDictionary(this);
        if (local_3c != eSuccess) {
          pTVar4 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar4,"ANSIFontWriter::WriteFont, failed to write encoding dictionary")
          ;
          goto LAB_002d2e88;
        }
        local_3c = eSuccess;
      }
      WriteToUnicodeMap(this,inObjectReference);
      inFontPostscriptName = psStack_38;
      iVar3 = (*inANSIFontWriterHelper->_vptr_IANSIFontWriterHelper[3])();
      local_3c = FontDescriptorWriter::WriteFontDescriptor
                           (&local_3d,inObjectReference_00,inFontPostscriptName,inFontInfo,
                            &this->mCharactersVector,inObjectsContext,
                            (IFontDescriptorHelper *)CONCAT44(extraout_var,iVar3));
    }
    else {
      pTVar4 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar4,
                        "ANSIFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write."
                       );
    }
  }
  else {
    pTVar4 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar4,
                      "ANSIFontWriter::WriteFont, Failed to start indirect object for written font %ld"
                      ,inFontOccurrence->mWrittenObjectID);
  }
LAB_002d2e88:
  EVar1 = local_3c;
  FontDescriptorWriter::~FontDescriptorWriter(&local_3d);
  return EVar1;
}

Assistant:

EStatusCode ANSIFontWriter::WriteFont(	FreeTypeFaceWrapper& inFontInfo,
											WrittenFontRepresentation* inFontOccurrence,
											ObjectsContext* inObjectsContext,
											IANSIFontWriterHelper* inANSIFontWriterHelper,
											const std::string& inSubsetFontName)
{
	EStatusCode status = PDFHummus::eSuccess;
	FontDescriptorWriter fontDescriptorWriter;


	do
	{
		status = inObjectsContext->StartNewIndirectObject(inFontOccurrence->mWrittenObjectID);
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG1("ANSIFontWriter::WriteFont, Failed to start indirect object for written font %ld", inFontOccurrence->mWrittenObjectID);
			break;
		}
		
		mFontInfo = &inFontInfo;
		mFontOccurrence = inFontOccurrence;
		mObjectsContext = inObjectsContext;

		DictionaryContext* fontContext = inObjectsContext->StartDictionary();

		// Type
		fontContext->WriteKey(scType);
		fontContext->WriteNameValue(scFont);

		// SubType
		fontContext->WriteKey(scSubtype);
		inANSIFontWriterHelper->WriteSubTypeValue(fontContext); // using the font particular type

		// BaseFont
		fontContext->WriteKey(scBaseFont);
		fontContext->WriteNameValue(inSubsetFontName);


		/*
			as for widths.
			i have to create a list/array of the characters ordered from lowest encoded value to highest, and fill it up with the charachters mapped
			to glyphs. this will allow me to later write the highest and lowest char codes, as well as loop the list and 
			write the widths.
		*/
		CalculateCharacterEncodingArray();

		WriteWidths(fontContext);

		if(inANSIFontWriterHelper->CanWriteDifferencesFromWinAnsi())
			CalculateDifferences();
		WriteEncoding(fontContext);

		// ToUnicode
		fontContext->WriteKey(scToUnicode);
		ObjectIDType toUnicodeMapObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
		fontContext->WriteNewObjectReferenceValue(toUnicodeMapObjectID);


		// FontDescriptor
		fontContext->WriteKey(scFontDescriptor);
		ObjectIDType fontDescriptorObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
		fontContext->WriteNewObjectReferenceValue(fontDescriptorObjectID);

		status = inObjectsContext->EndDictionary(fontContext);
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("ANSIFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write.");
			break;
		}

		inObjectsContext->EndIndirectObject();	

		// if necessary, write a dictionary encoding
		if(mDifferences.size() > 0) {
			status = WriteEncodingDictionary();
			if(status != PDFHummus::eSuccess)
			{
				TRACE_LOG("ANSIFontWriter::WriteFont, failed to write encoding dictionary");
				break;
			}
		}

		WriteToUnicodeMap(toUnicodeMapObjectID);
		status = fontDescriptorWriter.WriteFontDescriptor(fontDescriptorObjectID,
												inSubsetFontName,
												&inFontInfo,
												mCharactersVector,
												inObjectsContext,
												inANSIFontWriterHelper->GetCharsetWriter());
	}while(false);
	return status;
}